

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 VmByteCodeDump(SySet *pByteCode,ProcConsumer xConsumer,void *pUserData)

{
  sxi32 sVar1;
  VmInstr *pVVar2;
  char *pcVar3;
  int local_40;
  sxu32 n;
  sxi32 rc;
  VmInstr *pEnd;
  VmInstr *pInstr;
  void *pUserData_local;
  ProcConsumer xConsumer_local;
  SySet *pByteCode_local;
  
  pEnd = (VmInstr *)pByteCode->pBase;
  pVVar2 = pEnd + pByteCode->nUsed;
  local_40 = 0;
  (*xConsumer)("====================================================\nJX9 VM Dump   Copyright (C) 2012-2013 Symisc Systems\n                              http://jx9.symisc.net/\n====================================================\n"
               ,0xd4,pUserData);
  while( true ) {
    if (pVVar2 <= pEnd) {
      return 0;
    }
    pcVar3 = VmInstrToString((uint)pEnd->iOp);
    sVar1 = SyProcFormat(xConsumer,pUserData,"%s %8d %8u %#8x [%u]\n",pcVar3,(ulong)(uint)pEnd->iP1,
                         (ulong)pEnd->iP2,(int)pEnd->p3,local_40);
    if (sVar1 != 0) break;
    local_40 = local_40 + 1;
    pEnd = pEnd + 1;
  }
  return sVar1;
}

Assistant:

static sxi32 VmByteCodeDump(
	SySet *pByteCode,       /* Bytecode container */
	ProcConsumer xConsumer, /* Dump consumer callback */
	void *pUserData         /* Last argument to xConsumer() */
	)
{
	static const char zDump[] = {
		"====================================================\n"
		"JX9 VM Dump   Copyright (C) 2012-2013 Symisc Systems\n"
		"                              http://jx9.symisc.net/\n"
		"====================================================\n"
	};
	VmInstr *pInstr, *pEnd;
	sxi32 rc = SXRET_OK;
	sxu32 n;
	/* Point to the JX9 instructions */
	pInstr = (VmInstr *)SySetBasePtr(pByteCode);
	pEnd   = &pInstr[SySetUsed(pByteCode)];
	n = 0;
	xConsumer((const void *)zDump, sizeof(zDump)-1, pUserData);
	/* Dump instructions */
	for(;;){
		if( pInstr >= pEnd ){
			/* No more instructions */
			break;
		}
		/* Format and call the consumer callback */
		rc = SyProcFormat(xConsumer, pUserData, "%s %8d %8u %#8x [%u]\n", 
			VmInstrToString(pInstr->iOp), pInstr->iP1, pInstr->iP2, 
			SX_PTR_TO_INT(pInstr->p3), n);
		if( rc != SXRET_OK ){
			/* Consumer routine request an operation abort */
			return rc;
		}
		++n;
		pInstr++; /* Next instruction in the stream */
	}
	return rc;
}